

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O0

QString * __thiscall
QLocaleData::DataRange::getListEntry(DataRange *this,char16_t *table,qsizetype index)

{
  long lVar1;
  char16_t *in_RCX;
  DataRange *in_RDX;
  DataRange *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  listEntry(in_RSI,(char16_t *)in_RDX,(qsizetype)in_RCX);
  getData(in_RDX,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] QString getListEntry(const char16_t *table, qsizetype index) const
        {
            return listEntry(table, index).getData(table);
        }